

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O0

TIFFReadDirEntryErr TIFFReadDirEntryCheckedSlong8(TIFF *tif,TIFFDirEntry *direntry,int64_t *value)

{
  TIFFReadDirEntryErr TVar1;
  uint32_t local_30;
  undefined4 local_2c;
  uint32_t offset;
  TIFFReadDirEntryErr err;
  int64_t *value_local;
  TIFFDirEntry *direntry_local;
  TIFF *tif_local;
  
  _offset = (uint64_t *)value;
  value_local = (int64_t *)direntry;
  direntry_local = (TIFFDirEntry *)tif;
  if ((tif->tif_flags & 0x80000) == 0) {
    local_30 = (direntry->tdir_offset).toff_long;
    if ((tif->tif_flags & 0x80) != 0) {
      TIFFSwabLong(&local_30);
    }
    TVar1 = TIFFReadDirEntryData((TIFF *)direntry_local,(ulong)local_30,8,_offset);
    if (TVar1 != TIFFReadDirEntryErrOk) {
      return TVar1;
    }
    local_2c = 0;
  }
  else {
    *value = (int64_t)direntry->tdir_offset;
  }
  if (((direntry_local->tdir_offset).toff_long & 0x80) != 0) {
    TIFFSwabLong8(_offset);
  }
  return TIFFReadDirEntryErrOk;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntryCheckedSlong8(TIFF *tif, TIFFDirEntry *direntry, int64_t *value)
{
    if (!(tif->tif_flags & TIFF_BIGTIFF))
    {
        enum TIFFReadDirEntryErr err;
        uint32_t offset = direntry->tdir_offset.toff_long;
        if (tif->tif_flags & TIFF_SWAB)
            TIFFSwabLong(&offset);
        err = TIFFReadDirEntryData(tif, offset, 8, value);
        if (err != TIFFReadDirEntryErrOk)
            return (err);
    }
    else
        *value = *(int64_t *)(&direntry->tdir_offset);
    if (tif->tif_flags & TIFF_SWAB)
        TIFFSwabLong8((uint64_t *)value);
    return (TIFFReadDirEntryErrOk);
}